

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * data_to_hex(char *data,size_t len)

{
  char *local_30;
  char *iptr;
  char *optr;
  size_t i;
  size_t len_local;
  char *data_local;
  
  iptr = data_to_hex::buf;
  i = len;
  if (0xff < len) {
    i = 0xff;
  }
  local_30 = data;
  for (optr = (char *)0x0; optr < i; optr = optr + 1) {
    if ((data[(long)optr] < ' ') || ('~' < data[(long)optr])) {
      curl_msnprintf(iptr,4,"%%%02x",(ulong)(uint)(int)*local_30);
      iptr = iptr + 3;
    }
    else {
      *iptr = *local_30;
      iptr = iptr + 1;
    }
    local_30 = local_30 + 1;
  }
  *iptr = '\0';
  return data_to_hex::buf;
}

Assistant:

char *data_to_hex(char *data, size_t len)
{
  static char buf[256*3];
  size_t i;
  char *optr = buf;
  char *iptr = data;

  if(len > 255)
    len = 255;

  for(i = 0; i < len; i++) {
    if((data[i] >= 0x20) && (data[i] < 0x7f))
      *optr++ = *iptr++;
    else {
      msnprintf(optr, 4, "%%%02x", *iptr++);
      optr += 3;
    }
  }
  *optr = 0; /* in case no sprintf was used */

  return buf;
}